

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O0

void __thiscall fizplex::LPTest_AddRowFromRow_Test::TestBody(LPTest_AddRowFromRow_Test *this)

{
  Row row;
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  Row *pRVar4;
  char *in_R9;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  Row r;
  LP lp;
  bool *success;
  LP *this_00;
  double row_00;
  LP *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  double in_stack_fffffffffffffe80;
  LP *in_stack_fffffffffffffe90;
  string local_168;
  AssertHelper local_148;
  Message local_140;
  undefined1 local_131;
  AssertionResult local_130;
  string local_120;
  AssertHelper local_100;
  Message local_f8;
  undefined1 local_e9;
  AssertionResult local_e8;
  bool *local_d8;
  LP *pLStack_d0;
  double local_c8;
  bool *local_a8;
  LP *pLStack_a0;
  double local_98;
  
  LP::LP(in_stack_fffffffffffffe90);
  LP::Row::Row((Row *)&local_a8,LE,-1.33333,302.0);
  local_c8 = local_98;
  local_d8 = local_a8;
  pLStack_d0 = pLStack_a0;
  row.lower._0_7_ = in_stack_fffffffffffffe78;
  row._0_8_ = in_stack_fffffffffffffe70;
  row.lower._7_1_ = in_stack_fffffffffffffe7f;
  row.upper = in_stack_fffffffffffffe80;
  LP::add_row(pLStack_a0,row);
  sVar2 = LP::row_count((LP *)0x1c8e36);
  local_e9 = sVar2 == 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)pLStack_a0,local_a8,(type *)0x1c8e67);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
  success = local_a8;
  this_00 = pLStack_a0;
  row_00 = local_98;
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_120,(internal *)&local_e8,(AssertionResult *)"lp.row_count() == 1","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x51,pcVar3);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    testing::Message::~Message((Message *)0x1c8f66);
    success = local_a8;
    this_00 = pLStack_a0;
    row_00 = local_98;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c8fde);
  pRVar4 = LP::row_header(in_stack_fffffffffffffe70,(size_t)row_00);
  local_131 = pRVar4->type == LE;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,success,(type *)0x1c9018);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_130);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_168,(internal *)&local_130,
               (AssertionResult *)"lp.row_header(0u).type == RowType::LE","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x52,pcVar3);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    testing::Message::~Message((Message *)0x1c90ef);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c915b);
  LP::~LP(this_00);
  return;
}

Assistant:

TEST(LPTest, AddRowFromRow) {
  LP lp;
  LP::Row r(RowType::LE, -1.33333, 302);
  lp.add_row(r);
  EXPECT_TRUE(lp.row_count() == 1);
  EXPECT_TRUE(lp.row_header(0u).type == RowType::LE);
}